

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O0

U8 __thiscall SWI_WaveParser::GetByte(SWI_WaveParser *this,U64 *smplBegin,U64 *smplEnd,bool *isWake)

{
  U64 local_48;
  U64 locBegin;
  int local_38;
  SWI_Token t;
  int b;
  U8 ret_val;
  bool *isWake_local;
  U64 *smplEnd_local;
  U64 *smplBegin_local;
  SWI_WaveParser *this_local;
  
  t._3_1_ = SWI_Wake >> 0x18;
  *isWake = false;
  local_38 = 0;
  _b = isWake;
  isWake_local = (bool *)smplEnd;
  smplEnd_local = smplBegin;
  smplBegin_local = (U64 *)this;
  do {
    if (7 < local_38) {
      return t._3_1_;
    }
    t._3_1_ = (undefined1)((int)(uint)(byte)t._3_1_ >> 1);
    locBegin._4_4_ = GetToken(this,&local_48,(U64 *)isWake_local);
    if (locBegin._4_4_ == SWI_One) {
      t._3_1_ = t._3_1_ | 0x80;
    }
    else if (locBegin._4_4_ == SWI_Wake) {
      *smplEnd_local = local_48;
      *_b = true;
      return '\0';
    }
    if (local_38 == 0) {
      *smplEnd_local = local_48;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

U8 SWI_WaveParser::GetByte( U64& smplBegin, U64& smplEnd, bool& isWake )
{
    U8 ret_val = 0;
    int b;
    SWI_Token t;
    U64 locBegin;

    isWake = false;

    for( b = 0; b < 8; b++ )
    {
        ret_val >>= 1;

        t = GetToken( locBegin, smplEnd );

        if( t == SWI_One )
            ret_val |= ( 1 << 7 );
        else if( t == SWI_Wake )
        {
            smplBegin = locBegin;
            isWake = true;
            return 0;
        }

        if( b == 0 )
            smplBegin = locBegin;
    }

    return ret_val;
}